

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::cpp::CppGenerator::GenTypeBasic_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,Type *type,bool user_facing_type)

{
  EnumDef *def;
  char *__s;
  allocator<char> local_65;
  BaseType local_64;
  allocator<char> local_5d;
  BaseType base_type;
  allocator<char> local_49;
  string local_48;
  undefined1 local_21;
  Type *pTStack_20;
  bool user_facing_type_local;
  Type *type_local;
  CppGenerator *this_local;
  
  local_21 = user_facing_type;
  pTStack_20 = type;
  type_local = (Type *)this;
  this_local = (CppGenerator *)__return_storage_ptr__;
  if (user_facing_type) {
    if (type->enum_def != (EnumDef *)0x0) {
      def = type->enum_def;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
      BaseGenerator::WrapInNameSpace
                (__return_storage_ptr__,&this->super_BaseGenerator,&def->super_Definition,&local_48)
      ;
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator(&local_49);
      return __return_storage_ptr__;
    }
    if (type->base_type == BASE_TYPE_BOOL) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"bool",&local_5d);
      std::allocator<char>::~allocator(&local_5d);
      return __return_storage_ptr__;
    }
  }
  local_64 = type->base_type;
  if ((type->base_type == BASE_TYPE_UTYPE) && (type->enum_def != (EnumDef *)0x0)) {
    local_64 = (type->enum_def->underlying_type).base_type;
  }
  __s = StringOf(local_64);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_65)
  ;
  std::allocator<char>::~allocator(&local_65);
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeBasic(const Type &type, bool user_facing_type) const {
    if (user_facing_type) {
      if (type.enum_def) return WrapInNameSpace(*type.enum_def);
      if (type.base_type == BASE_TYPE_BOOL) return "bool";
    }
    // Get real underlying type for union type
    auto base_type = type.base_type;
    if (type.base_type == BASE_TYPE_UTYPE && type.enum_def != nullptr) {
      base_type = type.enum_def->underlying_type.base_type;
    }
    return StringOf(base_type);
  }